

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureUnitTests.cpp
# Opt level: O2

void __thiscall deqp::gles2::Functional::TextureUnitCase::~TextureUnitCase(TextureUnitCase *this)

{
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureUnitCase_0071c950;
  deinit(this);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->m_ndx2dOrCube).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>::~_Vector_base
            (&(this->m_texturesCube).
              super__Vector_base<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>);
  std::_Vector_base<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>::~_Vector_base
            (&(this->m_textures2d).
              super__Vector_base<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>);
  std::
  _Vector_base<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
  ::~_Vector_base(&(this->m_textureParams).
                   super__Vector_base<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
                 );
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->m_textureTypes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            );
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

TextureUnitCase::~TextureUnitCase (void)
{
	TextureUnitCase::deinit();
}